

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               ImGuiSliderFlags flags)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  ImGuiInputSource IVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_88;
  float local_84;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  uVar10 = v_max - v_min;
  if (v_speed == 0.0 && (v_min <= v_max && uVar10 != 0)) {
    v_speed = (float)uVar10 * GImGui->DragSpeedDefaultRatio;
  }
  uVar9 = (flags & 0x100000U) >> 0x14;
  uVar5 = data_type & 0xfffffffe;
  IVar6 = GImGui->ActiveIdSource;
  if (IVar6 == ImGuiInputSource_Mouse) {
    bVar4 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar4) ||
       (bVar4 = IsMouseDragPastThreshold(0,(pIVar3->IO).MouseDragThreshold * 0.5), !bVar4)) {
      IVar6 = pIVar3->ActiveIdSource;
      goto LAB_00154512;
    }
    fVar12 = (pIVar3->IO).NavInputs[(ulong)uVar9 + 0x1d];
    if ((pIVar3->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar3->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  else {
LAB_00154512:
    fVar12 = 0.0;
    if (IVar6 == ImGuiInputSource_Nav) {
      uVar7 = 0;
      if (uVar5 == 8) {
        uVar7 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar12 = (&local_38.x)[uVar9];
      if ((int)uVar7 < 0) {
        fVar11 = 1.1754944e-38;
      }
      else if (uVar7 < 10) {
        fVar11 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar7 * 4);
      }
      else {
        fVar11 = powf(10.0,(float)(int)-uVar7);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  fVar12 = fVar12 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar12 = -fVar12;
  }
  fVar11 = fVar12;
  if ((flags & 0x20U) != 0) {
    fVar11 = fVar12 / (float)uVar10;
  }
  bVar4 = false;
  if (v_max != v_min) {
    fVar12 = fVar11;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar12)) goto LAB_00154670;
    bVar4 = fVar12 < 0.0 && *v <= v_min;
  }
  if ((pIVar3->ActiveIdIsJustActivated == false) && (!bVar4)) {
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum + fVar12;
      pIVar3->DragCurrentAccumDirty = true;
    }
    else if ((pIVar3->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    uVar10 = *v;
    uVar9 = v_min;
    if ((flags & 0x20U) == 0) {
      local_88 = 0.0;
      local_84 = 0.0;
      uVar9 = uVar10 + (int)pIVar3->DragCurrentAccum;
    }
    else {
      if (uVar5 == 8) {
        iVar8 = ImParseFormatPrecision(format,3);
        fVar11 = (float)iVar8;
      }
      else {
        fVar11 = 1.0;
      }
      local_84 = powf(0.1,fVar11);
      local_88 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar10,v_min,v_max,true,local_84,0.0);
      if (((v_max != v_min) && (fVar11 = local_88 + pIVar3->DragCurrentAccum, 0.0 < fVar11)) &&
         (uVar9 = v_max, fVar11 < 1.0)) {
        fVar13 = local_84;
        if (local_84 <= (float)v_min) {
          fVar13 = (float)v_min;
        }
        fVar1 = local_84;
        if (local_84 <= (float)v_max) {
          fVar1 = (float)v_max;
        }
        fVar2 = fVar13;
        if (v_max < v_min) {
          fVar11 = 1.0 - fVar11;
          fVar2 = fVar1;
          fVar1 = fVar13;
        }
        fVar11 = powf(fVar1 / fVar2,fVar11);
        uVar9 = (uint)(long)(fVar11 * fVar2);
      }
    }
    if ((flags & 0x40U) == 0) {
      uVar9 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar9);
    }
    pIVar3->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      uVar10 = *v;
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)(int)(uVar9 - uVar10);
    }
    else {
      fVar11 = ScaleRatioFromValueT<unsigned_int,int,float>
                         (data_type,uVar9,v_min,v_max,true,local_84,0.0);
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (fVar11 - local_88);
      uVar10 = *v;
    }
    if ((v_min < v_max) && (uVar10 != uVar9)) {
      if ((uVar9 < v_min) || (((uVar5 != 8 && (uVar10 < uVar9)) && (fVar12 < 0.0)))) {
        uVar9 = v_min;
      }
      if ((v_max < uVar9) || (((uVar5 != 8 && (uVar9 < uVar10)) && (0.0 < fVar12)))) {
        uVar9 = v_max;
      }
    }
    if (uVar10 == uVar9) {
      return false;
    }
    *v = uVar9;
    return true;
  }
LAB_00154670:
  pIVar3->DragCurrentAccum = 0.0;
  pIVar3->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}